

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::Clone
          (TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>
           *this)

{
  long lVar1;
  _Rep_type *p_Var2;
  DecomposeType DVar3;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xe8);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix + -0x60);
  this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (TPZStrMatParInterface-in-TPZFrontStructMatrix<TPZFrontNonSym<double>,double,TPZStructMatrixTBBFlow<double>>
        ::construction_vtable + 0x88);
  *(undefined8 *)this_00 = 0x19c6da0;
  *(undefined4 *)&this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1);
  *(undefined1 *)
   ((long)&this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh + lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019c6600,(TPZStructMatrix *)this);
  this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (TPZStructMatrixT<double>-in-TPZFrontStructMatrix<TPZFrontNonSym<double>,double,TPZStructMatrixTBBFlow<double>>
        ::construction_vtable + 0x148);
  *(undefined8 *)this_00 = 0x19c66d8;
  TPZStructMatrixTBBFlow<double>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<double> *)&this_00->field_0xa0,
             &PTR_construction_vtable_104__019c6628,
             (TPZStructMatrixTBBFlow<double> *)
             &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  this_00[1].fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       (TPZFrontStructMatrix<TPZFrontNonSym<double>,double,TPZStructMatrixTBBFlow<double>>::vtable +
       0x238);
  *(undefined8 *)this_00 = 0x19c63b0;
  *(undefined8 *)&this_00->field_0xa0 = 0x19c6488;
  TPZVec<int>::TPZVec((TPZVec<int> *)(this_00 + 1),&this->fElementOrder);
  DVar3 = this->fDecomposeType;
  p_Var2 = &this_00[1].fMaterialIds._M_t;
  (p_Var2->_M_impl).super__Rb_tree_header._M_header._M_color = this->f_quiet;
  *(DecomposeType *)&(p_Var2->_M_impl).super__Rb_tree_header._M_header.field_0x4 = DVar3;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZFrontStructMatrix<TFront,TVar,TPar>::Clone(){
	
	auto* result =  new TPZFrontStructMatrix<TFront,TVar,TPar>(*this);
	return result;
}